

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

ITracker * __thiscall
Catch::TestCaseTracking::ITracker::findChild(ITracker *this,NameAndLocationRef *nameAndLocation)

{
  bool bVar1;
  ITracker *pIVar2;
  long lVar3;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  _Var4;
  long lVar5;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  __it;
  NameAndLocationRef *local_40;
  unique_ptr<Catch::TestCaseTracking::ITracker> *local_38;
  
  __it._M_current =
       (this->m_children).
       super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->m_children).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)local_38 - (long)__it._M_current;
  local_40 = nameAndLocation;
  for (lVar3 = lVar5 >> 5; _Var4._M_current = __it._M_current, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
            ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                          *)&local_40,__it);
    if (bVar1) goto LAB_00158bc0;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
            ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                          *)&local_40,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_00158bc0;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
            ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                          *)&local_40,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_00158bc0;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
            ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                          *)&local_40,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_00158bc0;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var4._M_current = local_38;
      if ((lVar5 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
                  ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                                *)&local_40,__it), _Var4._M_current = __it._M_current, bVar1))
      goto LAB_00158bc0;
      _Var4._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
            ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                          *)&local_40,_Var4);
    if (bVar1) goto LAB_00158bc0;
    __it._M_current = _Var4._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::$_0>
          ::operator()((_Iter_pred<Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
                        *)&local_40,__it);
  _Var4._M_current = local_38;
  if (bVar1) {
    _Var4._M_current = __it._M_current;
  }
LAB_00158bc0:
  if (_Var4._M_current ==
      (this->m_children).
      super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar2 = (ITracker *)0x0;
  }
  else {
    pIVar2 = (_Var4._M_current)->m_ptr;
  }
  return pIVar2;
}

Assistant:

ITracker* ITracker::findChild( NameAndLocationRef const& nameAndLocation ) {
        auto it = std::find_if(
            m_children.begin(),
            m_children.end(),
            [&nameAndLocation]( ITrackerPtr const& tracker ) {
                auto const& tnameAndLoc = tracker->nameAndLocation();
                if ( tnameAndLoc.location.line !=
                     nameAndLocation.location.line ) {
                    return false;
                }
                return tnameAndLoc == nameAndLocation;
            } );
        return ( it != m_children.end() ) ? it->get() : nullptr;
    }